

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.cpp
# Opt level: O0

double __thiscall pcd::random_signal_generator::impl::random_pm_one(impl *this)

{
  result_type_conflict1 rVar1;
  impl *this_local;
  
  rVar1 = std::uniform_real_distribution<double>::operator()
                    (&this->distribution_pm_one,&this->random_generator);
  return rVar1;
}

Assistant:

double random_signal_generator::impl::random_pm_one()
{
    return distribution_pm_one(random_generator);
}